

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall google::protobuf::Message::CheckInitialized(Message *this)

{
  uint uVar1;
  LogMessage *pLVar2;
  Descriptor *this_00;
  string *value;
  LogFinisher local_82;
  byte local_81;
  string local_80;
  byte local_49;
  LogMessage local_48;
  Message *local_10;
  Message *this_local;
  
  local_10 = this;
  uVar1 = (*(this->super_MessageLite)._vptr_MessageLite[5])();
  local_49 = 0;
  local_81 = 0;
  if ((uVar1 & 1) == 0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/message.cc"
               ,0x6b);
    local_49 = 1;
    pLVar2 = internal::LogMessage::operator<<(&local_48,"CHECK failed: IsInitialized(): ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"Message of type \"");
    this_00 = GetDescriptor(this);
    value = Descriptor::full_name_abi_cxx11_(this_00);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,value);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"\" is missing required fields: ");
    (*(this->super_MessageLite)._vptr_MessageLite[6])(&local_80);
    local_81 = 1;
    pLVar2 = internal::LogMessage::operator<<(pLVar2,&local_80);
    internal::LogFinisher::operator=(&local_82,pLVar2);
  }
  if ((local_81 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_80);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_48);
  }
  return;
}

Assistant:

void Message::CheckInitialized() const {
  GOOGLE_CHECK(IsInitialized())
    << "Message of type \"" << GetDescriptor()->full_name()
    << "\" is missing required fields: " << InitializationErrorString();
}